

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O0

ptr __thiscall
agge::tests::mocks::create_font<1ul,1ul>
          (mocks *this,font_metrics *metrics_,char_to_index (*indices) [1],glyph (*glyphs) [1])

{
  font *this_00;
  font_accessor *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr pVar1;
  shared_ptr<agge::font::accessor> local_38;
  glyph (*local_28) [1];
  glyph (*glyphs_local) [1];
  char_to_index (*indices_local) [1];
  font_metrics *metrics__local;
  
  local_28 = glyphs;
  glyphs_local = (glyph (*) [1])indices;
  indices_local = (char_to_index (*) [1])metrics_;
  metrics__local = (font_metrics *)this;
  this_00 = (font *)operator_new(0x498);
  this_01 = (font_accessor *)operator_new(0xb0);
  font_accessor::font_accessor<1ul,1ul>
            (this_01,(font_metrics *)indices_local,(char_to_index (*) [1])glyphs_local,local_28);
  std::shared_ptr<agge::font::accessor>::shared_ptr<agge::tests::mocks::font_accessor,void>
            (&local_38,this_01);
  font::font(this_00,&local_38,1.0);
  std::shared_ptr<agge::font>::shared_ptr<agge::font,void>((shared_ptr<agge::font> *)this,this_00);
  std::shared_ptr<agge::font::accessor>::~shared_ptr(&local_38);
  pVar1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr)pVar1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline font::ptr create_font(const font_metrics &metrics_,
				const font_accessor::char_to_index (&indices)[indices_n], font_accessor::glyph (&glyphs)[glyphs_n])
			{	return font::ptr(new font(font::accessor_ptr(new font_accessor(metrics_, indices, glyphs))));	}